

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O0

void __thiscall
OpenDataServerCommand::OpenDataServerCommand
          (OpenDataServerCommand *this,DataCommands *dataCommands,DataBinds *dataBinds,
          DataVars *dataVars,pthread_mutex_t *mutex)

{
  pthread_mutex_t *mutex_local;
  DataVars *dataVars_local;
  DataBinds *dataBinds_local;
  DataCommands *dataCommands_local;
  OpenDataServerCommand *this_local;
  
  Command::Command(&this->super_Command);
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_doCommand_0016c610;
  std::vector<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>::vector(&this->deathMap1);
  std::vector<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>::
  vector(&this->deathMap2);
  this->dataCommands = dataCommands;
  this->dataBinds = dataBinds;
  this->dataVars = dataVars;
  memcpy(&this->mutex,mutex,0x28);
  return;
}

Assistant:

OpenDataServerCommand::OpenDataServerCommand(DataCommands *dataCommands, DataBinds *dataBinds, DataVars *dataVars,
                                             pthread_mutex_t &mutex) {
    this->dataCommands = dataCommands;
    this->dataBinds = dataBinds;
    this->dataVars = dataVars;
    this->mutex = mutex;
}